

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceBase.h
# Opt level: O1

void anurbs::SurfaceBase<3L>::register_python(module *m)

{
  class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *pcVar1;
  class_<anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::SurfaceBase<3L>_>_> *pcVar2;
  class_<anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::SurfaceBase<3L>_>_> py_class;
  string name;
  anon_class_1_0_00000001 local_119;
  class_<anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::SurfaceBase<3L>_>_> local_118;
  handle local_110;
  long *local_108;
  long local_f8 [2];
  arg local_e8;
  arg local_d8;
  code *local_c8;
  undefined8 local_c0;
  arg local_b8;
  arg local_a8;
  arg local_98;
  offset_in_Model_to_subr local_88 [2];
  arg local_78;
  arg local_68;
  offset_in_Model_to_subr local_58 [8];
  
  SurfaceBase<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::SurfaceBase<3L>_>_>::class_<>
            (&local_118,(m->super_object).super_handle.m_ptr,(char *)local_108);
  local_c8 = (code *)0x11;
  local_c0 = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<long(anurbs::SurfaceBase<3l>::*)()const>
                     ((class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
                      &local_118,"degree_u",(offset_in_Model_to_subr *)&local_c8);
  local_d8.name = (char *)0x19;
  local_d8._8_8_ = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<long(anurbs::SurfaceBase<3l>::*)()const>
                     (pcVar1,"degree_v",(offset_in_Model_to_subr *)&local_d8);
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<anurbs::SurfaceBase<3l>::register_python(pybind11::module&)::_lambda(anurbs::SurfaceBase<3l>&)_1_>
                     (pcVar1,"dimension",&local_119);
  local_e8.name = (char *)0x21;
  local_e8._8_8_ = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<anurbs::Interval(anurbs::SurfaceBase<3l>::*)()const>
                     (pcVar1,"domain_u",(offset_in_Model_to_subr *)&local_e8);
  local_58[6] = 0x29;
  local_58[7] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<anurbs::Interval(anurbs::SurfaceBase<3l>::*)()const>
                     (pcVar1,"domain_v",local_58 + 6);
  local_58[4] = 0x41;
  local_58[5] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::SurfaceBase<3l>::*)()const>
                     (pcVar1,"spans_u",local_58 + 4);
  local_58[2] = 0x49;
  local_58[3] = 0;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::SurfaceBase<3l>::*)()const>
                     (pcVar1,"spans_v",local_58 + 2);
  local_58[0] = 0x31;
  local_58[1] = 0;
  local_68.name = "u";
  local_68._8_1_ = 2;
  local_78.name = "v";
  local_78._8_1_ = 2;
  pcVar1 = (class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)
           pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::SurfaceBase<3l>::*)(double,double)const,pybind11::arg,pybind11::arg>
                     (pcVar1,"point_at",local_58,&local_68,&local_78);
  local_88[0] = 0x39;
  local_88[1] = 0;
  local_98.name = "u";
  local_98._8_1_ = 2;
  local_a8.name = "v";
  local_a8._8_1_ = 2;
  local_b8.name = "order";
  local_b8._8_1_ = 2;
  pcVar2 = pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
           def<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>(anurbs::SurfaceBase<3l>::*)(double,double,long)const,pybind11::arg,pybind11::arg,pybind11::arg>
                     (pcVar1,"derivatives_at",local_88,&local_98,&local_a8,&local_b8);
  local_110.m_ptr = (pcVar2->super_generic_type).super_object.super_handle.m_ptr;
  if (local_110.m_ptr != (PyObject *)0x0) {
    (local_110.m_ptr)->ob_refcnt = (local_110.m_ptr)->ob_refcnt + 1;
  }
  pybind11::object::~object((object *)&local_118);
  local_c8 = normal_at;
  local_c0 = 0;
  local_d8.name = "u";
  local_d8._8_1_ = 2;
  local_e8.name = "v";
  local_e8._8_1_ = 2;
  pybind11::class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>>::
  def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::SurfaceBase<3l>::*)(double,double)const,pybind11::arg,pybind11::arg>
            ((class_<anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::SurfaceBase<3l>>> *)&local_110,
             "normal_at",(offset_in_Model_to_subr *)&local_c8,&local_d8,&local_e8);
  pybind11::object::~object((object *)&local_110);
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        auto py_class = py::class_<Type, Holder>(m, name.c_str())
            // read-only property
            .def_property_readonly("degree_u", &Type::degree_u)
            .def_property_readonly("degree_v", &Type::degree_v)
            .def_property_readonly("dimension", [](Type&) {
                return Type::dimension(); })
            .def_property_readonly("domain_u", &Type::domain_u)
            .def_property_readonly("domain_v", &Type::domain_v)
            .def_property_readonly("spans_u", &Type::spans_u)
            .def_property_readonly("spans_v", &Type::spans_v)
            // methods
            .def("point_at", &Type::point_at, "u"_a, "v"_a)
            .def("derivatives_at", &Type::derivatives_at, "u"_a, "v"_a,
                "order"_a)
        ;

        if constexpr(dimension() == 3) {
            py_class.def("normal_at", &Type::normal_at, "u"_a, "v"_a);
        }
    }